

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-vec1.c
# Opt level: O2

void mul_mat_vec_f32_2(float *src0,float *src1,float *dst,int nrows,int ncols)

{
  long lVar1;
  ulong uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar1 = (long)ncols;
  uVar4 = 0;
  uVar2 = (ulong)(uint)nrows;
  if (nrows < 1) {
    uVar2 = uVar4;
  }
  pfVar5 = src0 + 0x18;
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    auVar6 = ZEXT816(0) << 0x40;
    lVar3 = 0;
    auVar9 = ZEXT816(0) << 0x40;
    auVar8 = ZEXT816(0) << 0x40;
    auVar10 = ZEXT816(0) << 0x40;
    while( true ) {
      if ((int)(ncols & 0xffffffe0) <= lVar3) break;
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),*(undefined1 (*) [32])(pfVar5 + lVar3 + -0x18),
                                *(undefined1 (*) [32])(src1 + lVar3));
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),*(undefined1 (*) [32])(pfVar5 + lVar3 + -0x10),
                               *(undefined1 (*) [32])(src1 + lVar3 + 8));
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),*(undefined1 (*) [32])(pfVar5 + lVar3 + -8),
                               *(undefined1 (*) [32])(src1 + lVar3 + 0x10));
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),*(undefined1 (*) [32])(pfVar5 + lVar3),
                               *(undefined1 (*) [32])(src1 + lVar3 + 0x18));
      lVar3 = lVar3 + 0x20;
    }
    auVar7._0_4_ = auVar6._0_4_ + auVar9._0_4_ + auVar8._0_4_ + auVar10._0_4_ + 0.0;
    auVar7._4_4_ = auVar6._4_4_ + auVar9._4_4_ + auVar8._4_4_ + auVar10._4_4_ + 0.0;
    auVar7._8_4_ = auVar6._8_4_ + auVar9._8_4_ + auVar8._8_4_ + auVar10._8_4_ + 0.0;
    auVar7._12_4_ = auVar6._12_4_ + auVar9._12_4_ + auVar8._12_4_ + auVar10._12_4_ + 0.0;
    auVar10 = vshufpd_avx(auVar7,auVar7,1);
    auVar8._0_4_ = auVar7._0_4_ + auVar10._0_4_;
    auVar8._4_4_ = auVar7._4_4_ + auVar10._4_4_;
    auVar8._8_4_ = auVar7._8_4_ + auVar10._8_4_;
    auVar8._12_4_ = auVar7._12_4_ + auVar10._12_4_;
    auVar10 = vhaddps_avx(auVar8,auVar8);
    dst[uVar4] = auVar10._0_4_;
    for (lVar3 = (long)(int)(ncols & 0xffffffe0); lVar3 < lVar1; lVar3 = lVar3 + 1) {
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)src0[lVar3]),ZEXT416((uint)src1[lVar3]));
      dst[uVar4] = auVar10._0_4_;
    }
    pfVar5 = pfVar5 + lVar1;
    src0 = src0 + lVar1;
  }
  return;
}

Assistant:

void mul_mat_vec_f32_2(
    const float * restrict src0,
    const float * restrict src1,
    float * dst,
    int nrows,
    int ncols) {

    const int ncols32 = ncols & ~31;

    for (int i = 0; i < nrows; i++) {
        __m256 sum0 = _mm256_setzero_ps();
        __m256 sum1 = _mm256_setzero_ps();
        __m256 sum2 = _mm256_setzero_ps();
        __m256 sum3 = _mm256_setzero_ps();

        const float * restrict src0_row = src0 + i*ncols;
        for (int j = 0; j < ncols32; j += 32) {
            __m256 a0 = _mm256_loadu_ps(src0_row + j + 0);
            __m256 a1 = _mm256_loadu_ps(src0_row + j + 8);
            __m256 a2 = _mm256_loadu_ps(src0_row + j + 16);
            __m256 a3 = _mm256_loadu_ps(src0_row + j + 24);
            __m256 b0 = _mm256_loadu_ps(src1 + j + 0);
            __m256 b1 = _mm256_loadu_ps(src1 + j + 8);
            __m256 b2 = _mm256_loadu_ps(src1 + j + 16);
            __m256 b3 = _mm256_loadu_ps(src1 + j + 24);
#if defined(__FMA__)
            sum0 = _mm256_fmadd_ps(a0, b0, sum0);
            sum1 = _mm256_fmadd_ps(a1, b1, sum1);
            sum2 = _mm256_fmadd_ps(a2, b2, sum2);
            sum3 = _mm256_fmadd_ps(a3, b3, sum3);
#else
            sum0 = _mm256_add_ps(_mm256_mul_ps(a0, b0), sum0);
            sum1 = _mm256_add_ps(_mm256_mul_ps(a1, b1), sum1);
            sum2 = _mm256_add_ps(_mm256_mul_ps(a2, b2), sum2);
            sum3 = _mm256_add_ps(_mm256_mul_ps(a3, b3), sum3);
#endif
        }
        dst[i] = reduce_vector8_0(_mm256_add_ps(_mm256_add_ps(sum0, sum1), _mm256_add_ps(sum2, sum3)));

        for (int j = ncols32; j < ncols; j++) {
            dst[i] += src0[i*ncols + j]*src1[j];
        }
    }
}